

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  uchar *puVar1;
  long local_28;
  size_t i;
  LodePNGColorMode *source_local;
  LodePNGColorMode *dest_local;
  
  lodepng_color_mode_cleanup(dest);
  memcpy(dest,source,0x28);
  if (source->palette != (uchar *)0x0) {
    puVar1 = (uchar *)lodepng_malloc(0x400);
    dest->palette = puVar1;
    if ((dest->palette == (uchar *)0x0) && (source->palettesize != 0)) {
      return 0x53;
    }
    for (local_28 = 0; local_28 != source->palettesize << 2; local_28 = local_28 + 1) {
      dest->palette[local_28] = source->palette[local_28];
    }
  }
  return 0;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source)
{
  size_t i;
  lodepng_color_mode_cleanup(dest);
  *dest = *source;
  if(source->palette)
  {
    dest->palette = (unsigned char*)lodepng_malloc(1024);
    if(!dest->palette && source->palettesize) return 83; /*alloc fail*/
    for(i = 0; i != source->palettesize * 4; ++i) dest->palette[i] = source->palette[i];
  }
  return 0;
}